

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

int QMetaTypeIdQObject<QLocationPermission,_512>::qt_metatype_id(void)

{
  long lVar1;
  QByteArray *this;
  long in_FS_OFFSET;
  int newId;
  char *cName;
  int id;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffffa0;
  qsizetype in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x916d22);
  if (local_24 == 0) {
    this = (QByteArray *)
           QMetaObject::className
                     ((QMetaObject *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QByteArray::QByteArray
              (this,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc0);
    local_24 = qRegisterNormalizedMetaType<QLocationPermission>((QByteArray *)0x916d70);
    QByteArray::~QByteArray((QByteArray *)0x916d80);
    QBasicAtomicInteger<int>::storeRelease(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *const cName = T::staticMetaObject.className();
        const int newId = qRegisterNormalizedMetaType<T>(cName);
        metatype_id.storeRelease(newId);
        return newId;
    }